

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_name.cc
# Opt level: O1

int x509_name_canon(X509_NAME *a)

{
  uchar **out;
  byte *pbVar1;
  ASN1_STRING *dst;
  ASN1_STRING *str;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  OPENSSL_STACK *sk;
  undefined8 *puVar7;
  OPENSSL_STACK *sk_00;
  size_t sVar8;
  ASN1_VALUE *val;
  ASN1_OBJECT *pAVar9;
  ulong uVar10;
  byte *pbVar11;
  uchar *puVar12;
  uchar *p;
  int local_70;
  int local_64;
  uchar *local_38;
  
  if (a->canon_enc != (uchar *)0x0) {
    OPENSSL_free(a->canon_enc);
    a->canon_enc = (uchar *)0x0;
  }
  sVar6 = OPENSSL_sk_num((OPENSSL_STACK *)a->entries);
  if (sVar6 == 0) {
    a->canon_enclen = 0;
    return 1;
  }
  sk = OPENSSL_sk_new_null();
  if (sk != (OPENSSL_STACK *)0x0) {
    sVar6 = OPENSSL_sk_num((OPENSSL_STACK *)a->entries);
    if (sVar6 != 0) {
      local_64 = -1;
      sVar6 = 0;
      sk_00 = (OPENSSL_STACK *)0x0;
      do {
        puVar7 = (undefined8 *)OPENSSL_sk_value((OPENSSL_STACK *)a->entries,sVar6);
        if (*(int *)(puVar7 + 2) != local_64) {
          sk_00 = OPENSSL_sk_new_null();
          if (sk_00 == (OPENSSL_STACK *)0x0) goto LAB_001a5734;
          sVar8 = OPENSSL_sk_push(sk,sk_00);
          if (sVar8 == 0) {
            OPENSSL_sk_free(sk_00);
            goto LAB_001a5734;
          }
          local_64 = *(int *)(puVar7 + 2);
        }
        val = ASN1_item_new((ASN1_ITEM *)&X509_NAME_ENTRY_it);
        local_70 = 0;
        iVar4 = 0;
        if (val == (ASN1_VALUE *)0x0) goto LAB_001a5713;
        pAVar9 = OBJ_dup((ASN1_OBJECT *)*puVar7);
        *(ASN1_OBJECT **)val = pAVar9;
        dst = *(ASN1_STRING **)(val + 8);
        str = (ASN1_STRING *)puVar7[1];
        uVar10 = ASN1_tag2bit(str->type);
        if ((uVar10 & 0x2956) == 0) {
          iVar4 = ASN1_STRING_copy(dst,str);
          if (iVar4 == 0) goto LAB_001a5740;
        }
        else {
          dst->type = 0xc;
          out = &dst->data;
          uVar3 = ASN1_STRING_to_UTF8(out,str);
          dst->length = uVar3;
          if (uVar3 == 0xffffffff) goto LAB_001a5740;
          pbVar11 = *out;
          if (0 < (int)uVar3) {
            do {
              iVar4 = OPENSSL_isspace((uint)*pbVar11);
              if (iVar4 == 0) goto LAB_001a55f8;
              pbVar11 = pbVar11 + 1;
              bVar2 = 1 < (int)uVar3;
              uVar3 = uVar3 - 1;
            } while (bVar2);
            uVar3 = 0;
          }
LAB_001a55f8:
          if (0 < (int)uVar3) {
            uVar10 = (ulong)uVar3;
            iVar4 = uVar3 + 1;
            do {
              iVar5 = OPENSSL_isspace((uint)pbVar11[uVar10 - 1]);
              if (iVar5 == 0) {
                uVar3 = (uint)uVar10;
                goto LAB_001a5636;
              }
              uVar10 = uVar10 - 1;
              iVar4 = iVar4 + -1;
            } while (1 < iVar4);
            uVar3 = 0;
          }
LAB_001a5636:
          puVar12 = *out;
          if (0 < (int)uVar3) {
            iVar4 = 0;
            do {
              iVar5 = OPENSSL_isspace((uint)*pbVar11);
              if (iVar5 == 0) {
                iVar5 = OPENSSL_tolower((uint)*pbVar11);
                *puVar12 = (uchar)iVar5;
                pbVar11 = pbVar11 + 1;
                iVar4 = iVar4 + 1;
              }
              else {
                *puVar12 = ' ';
                do {
                  iVar4 = iVar4 + 1;
                  pbVar1 = pbVar11 + 1;
                  pbVar11 = pbVar11 + 1;
                  iVar5 = OPENSSL_isspace((uint)*pbVar1);
                } while (iVar5 != 0);
              }
              puVar12 = puVar12 + 1;
            } while (iVar4 < (int)uVar3);
          }
          dst->length = (int)puVar12 - *(int *)&dst->data;
        }
        sVar8 = OPENSSL_sk_push(sk_00,val);
        if (sVar8 == 0) goto LAB_001a5740;
        sVar6 = sVar6 + 1;
        sVar8 = OPENSSL_sk_num((OPENSSL_STACK *)a->entries);
      } while (sVar6 < sVar8);
    }
    val = (ASN1_VALUE *)0x0;
    uVar3 = i2d_name_canon((stack_st_STACK_OF_X509_NAME_ENTRY *)sk,(uchar **)0x0);
    local_70 = 0;
    if ((int)uVar3 < 0) goto LAB_001a5740;
    a->canon_enclen = uVar3;
    local_38 = (uchar *)OPENSSL_malloc((ulong)uVar3);
    if (local_38 != (uchar *)0x0) {
      a->canon_enc = local_38;
      i2d_name_canon((stack_st_STACK_OF_X509_NAME_ENTRY *)sk,&local_38);
      iVar4 = 1;
LAB_001a5713:
      local_70 = iVar4;
      val = (ASN1_VALUE *)0x0;
      goto LAB_001a5740;
    }
  }
LAB_001a5734:
  val = (ASN1_VALUE *)0x0;
  local_70 = 0;
LAB_001a5740:
  if (val != (ASN1_VALUE *)0x0) {
    ASN1_item_free(val,(ASN1_ITEM *)&X509_NAME_ENTRY_it);
  }
  if (sk != (OPENSSL_STACK *)0x0) {
    OPENSSL_sk_pop_free_ex
              (sk,sk_STACK_OF_X509_NAME_ENTRY_call_free_func,local_sk_X509_NAME_ENTRY_pop_free);
  }
  return local_70;
}

Assistant:

static int x509_name_canon(X509_NAME *a) {
  unsigned char *p;
  STACK_OF(STACK_OF_X509_NAME_ENTRY) *intname = NULL;
  STACK_OF(X509_NAME_ENTRY) *entries = NULL;
  X509_NAME_ENTRY *entry, *tmpentry = NULL;
  int set = -1, ret = 0, len;
  size_t i;

  if (a->canon_enc) {
    OPENSSL_free(a->canon_enc);
    a->canon_enc = NULL;
  }
  // Special case: empty X509_NAME => null encoding
  if (sk_X509_NAME_ENTRY_num(a->entries) == 0) {
    a->canon_enclen = 0;
    return 1;
  }
  intname = sk_STACK_OF_X509_NAME_ENTRY_new_null();
  if (!intname) {
    goto err;
  }
  for (i = 0; i < sk_X509_NAME_ENTRY_num(a->entries); i++) {
    entry = sk_X509_NAME_ENTRY_value(a->entries, i);
    if (entry->set != set) {
      entries = sk_X509_NAME_ENTRY_new_null();
      if (!entries) {
        goto err;
      }
      if (!sk_STACK_OF_X509_NAME_ENTRY_push(intname, entries)) {
        sk_X509_NAME_ENTRY_free(entries);
        goto err;
      }
      set = entry->set;
    }
    tmpentry = X509_NAME_ENTRY_new();
    if (tmpentry == NULL) {
      goto err;
    }
    tmpentry->object = OBJ_dup(entry->object);
    if (!asn1_string_canon(tmpentry->value, entry->value)) {
      goto err;
    }
    if (!sk_X509_NAME_ENTRY_push(entries, tmpentry)) {
      goto err;
    }
    tmpentry = NULL;
  }

  // Finally generate encoding

  len = i2d_name_canon(intname, NULL);
  if (len < 0) {
    goto err;
  }
  a->canon_enclen = len;

  p = reinterpret_cast<uint8_t *>(OPENSSL_malloc(a->canon_enclen));

  if (!p) {
    goto err;
  }

  a->canon_enc = p;

  i2d_name_canon(intname, &p);

  ret = 1;

err:

  if (tmpentry) {
    X509_NAME_ENTRY_free(tmpentry);
  }
  if (intname) {
    sk_STACK_OF_X509_NAME_ENTRY_pop_free(intname,
                                         local_sk_X509_NAME_ENTRY_pop_free);
  }
  return ret;
}